

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ships.cpp
# Opt level: O1

void verify_horizontal_right(Board *board,int row,int col,Ship *ship)

{
  int iVar1;
  long lVar2;
  
  lVar2 = (long)ship->length + (long)col;
  if ((int)lVar2 <= board->column) {
    iVar1 = std::__cxx11::string::compare
                      ((char *)(*(long *)&(board->matrix).
                                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[row].
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data + lVar2 * 0x20 + -0x20));
    if (iVar1 == 0) {
      lVar2 = (long)ship->length + (long)col;
      if (((int)lVar2 < board->column) &&
         (iVar1 = std::__cxx11::string::compare
                            ((char *)(lVar2 * 0x20 +
                                     *(long *)&(board->matrix).
                                               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[row].
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data)), iVar1 == 0)) {
        ship->sRow = row;
        ship->sCol = col;
LAB_00102a0c:
        ship->orientation = 'H';
        ship->direction = 1;
        return;
      }
      iVar1 = board->column;
      ship->sRow = row;
      ship->sCol = col;
      if (iVar1 <= ship->length + col) goto LAB_00102a0c;
      goto LAB_001029a4;
    }
  }
  ship->sRow = row;
  ship->sCol = col;
LAB_001029a4:
  ship->orientation = 'N';
  ship->direction = 0;
  return;
}

Assistant:

void verify_horizontal_right( Board *board, int row, int col, Ship *ship )
{
	/*! Checks if the current position plus the rest of the ship exceeds
	 *  the superior border or touches another ship
	 */
    if( ( col + ship->length - 1 <= board->column - 1 ) and ( board->matrix[row][col + ship->length - 1] == "~" ) )
	{
        if( ( col + ship->length <= board->column - 1 ) and ( board->matrix[row][col + ship->length] == "~" ) ) 
        {
            ship->set_values( row, col, 'H', 1 );
        }
        else if( col + ship->length > board->column - 1 )
        {
            ship->set_values( row, col, 'H', 1 );
        }
        else
        {
            ship->set_values( row, col, 'N' , 0 );
        }
    }
    else
    {
        ship->set_values( row, col, 'N' , 0 );
    }
}